

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_SoundAlert
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AActor *target;
  AActor *emitter;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_003feb43;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003feb2a:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003feb43:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x10b,
                  "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  emitter = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (emitter == (AActor *)0x0) goto LAB_003fea71;
    bVar1 = DObject::IsKindOf((DObject *)emitter,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003feb43;
    }
  }
  else {
    if (emitter != (AActor *)0x0) goto LAB_003feb2a;
LAB_003fea71:
    emitter = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_003feb62;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003feb33:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003feb62:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x10c,
                  "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  target = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (target == (AActor *)0x0) goto LAB_003feabd;
    bVar1 = DObject::IsKindOf((DObject *)target,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "target == NULL || target->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003feb62;
    }
  }
  else {
    if (target != (AActor *)0x0) goto LAB_003feb33;
LAB_003feabd:
    target = (AActor *)0x0;
  }
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003feb8a;
    }
    iVar2 = param[2].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar3 = "(param[paramnum]).Type == REGT_INT";
LAB_003feb8a:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x10d,
                    "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\x01') goto LAB_003feb08;
      pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003feba9;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\x01') {
LAB_003feb08:
    P_NoiseAlert(target,emitter,iVar2 != 0,param[3].field_0.f);
    return 0;
  }
  pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003feba9:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x10e,
                "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SoundAlert)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(target, AActor);
	PARAM_BOOL_DEF(splash);
	PARAM_FLOAT_DEF(maxdist);
	// Note that the emitter is self, not the target of the alert! Target can be NULL.
	P_NoiseAlert(target, self, splash, maxdist);
	return 0;
}